

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O3

Error llvm::handleErrorImpl<llvm::DWARFContext::dumpWarning(llvm::Error)::__0>
                (unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *Payload
                ,anon_class_1_0_00000001 *Handler)

{
  long *plVar1;
  char *__n;
  char cVar2;
  Error EVar3;
  raw_ostream *prVar4;
  size_t in_RCX;
  void *__buf;
  long *local_40;
  void *local_38;
  long local_30 [2];
  
  EVar3.Payload =
       (ErrorInfoBase *)
       (**(code **)(**(long **)Handler + 0x30))(*(long **)Handler,&ErrorInfoBase::ID);
  plVar1 = *(long **)Handler;
  if ((char)EVar3.Payload == '\0') {
    *(undefined8 *)Handler = 0;
    (Payload->_M_t).
    super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>._M_t.
    super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
    super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl =
         (ErrorInfoBase *)((ulong)plVar1 | 1);
  }
  else {
    *(undefined8 *)Handler = 0;
    cVar2 = (**(code **)(*plVar1 + 0x30))(plVar1,&ErrorInfoBase::ID);
    if (cVar2 == '\0') {
      __assert_fail("appliesTo(*E) && \"Applying incorrect handler\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/Support/Error.h"
                    ,0x329,
                    "static Error llvm::ErrorHandlerTraits<void (&)(llvm::ErrorInfoBase &)>::apply(HandlerT &&, std::unique_ptr<ErrorInfoBase>) [HandlerT = void (&)(llvm::ErrorInfoBase &), HandlerT = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFContext.cpp:1880:39)]"
                   );
    }
    prVar4 = WithColor::warning();
    (**(code **)(*plVar1 + 0x18))(&local_40,plVar1);
    prVar4 = (raw_ostream *)raw_ostream::write(prVar4,(int)local_40,local_38,in_RCX);
    __n = prVar4->OutBufCur;
    if (__n < prVar4->OutBufEnd) {
      prVar4->OutBufCur = __n + 1;
      *__n = '\n';
    }
    else {
      raw_ostream::write(prVar4,10,__buf,(size_t)__n);
    }
    if (local_40 != local_30) {
      operator_delete(local_40,local_30[0] + 1);
    }
    (Payload->_M_t).
    super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>._M_t.
    super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
    super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl = (ErrorInfoBase *)0x1;
    EVar3.Payload = (ErrorInfoBase *)(**(code **)(*plVar1 + 8))(plVar1);
  }
  return (Error)EVar3.Payload;
}

Assistant:

Error handleErrorImpl(std::unique_ptr<ErrorInfoBase> Payload,
                      HandlerT &&Handler, HandlerTs &&... Handlers) {
  if (ErrorHandlerTraits<HandlerT>::appliesTo(*Payload))
    return ErrorHandlerTraits<HandlerT>::apply(std::forward<HandlerT>(Handler),
                                               std::move(Payload));
  return handleErrorImpl(std::move(Payload),
                         std::forward<HandlerTs>(Handlers)...);
}